

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O1

tuple<slang::ast::CaseStatementCondition,_slang::ast::CaseStatementCheck> __thiscall
slang::ast::getConditionAndCheck(ast *this,CaseStatementSyntax *syntax)

{
  TokenKind TVar1;
  uint uVar2;
  logic_error *plVar3;
  long *plVar4;
  uint uVar5;
  size_type *psVar6;
  long *plVar7;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar2 = *(int *)&syntax->caseKeyword - 0x74;
  if (2 < (ushort)uVar2) {
    plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Statements.cpp"
               ,"");
    plVar4 = (long *)std::__cxx11::string::append((char *)local_90);
    local_d0._M_dataplus._M_p = (pointer)*plVar4;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_d0._M_dataplus._M_p == psVar6) {
      local_d0.field_2._M_allocated_capacity = *psVar6;
      local_d0.field_2._8_8_ = plVar4[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar6;
    }
    local_d0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::to_string(&local_70,0x3f0);
    std::operator+(&local_50,&local_d0,&local_70);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_b0 = (long *)*plVar4;
    plVar7 = plVar4 + 2;
    if (local_b0 == plVar7) {
      local_a0 = *plVar7;
      lStack_98 = plVar4[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar7;
    }
    local_a8 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_f0 = (long *)*plVar4;
    plVar7 = plVar4 + 2;
    if (local_f0 == plVar7) {
      local_e0 = *plVar7;
      lStack_d8 = plVar4[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar7;
    }
    local_e8 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::logic_error::logic_error(plVar3,(string *)&local_f0);
    __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  TVar1 = (syntax->uniqueOrPriority).kind;
  uVar5 = (uint)TVar1;
  if (TVar1 < UniqueKeyword) {
    if (TVar1 != Unknown) {
      if (TVar1 != PriorityKeyword) {
LAB_0027df01:
        plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
        local_90[0] = local_80;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_90,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Statements.cpp"
                   ,"");
        plVar4 = (long *)std::__cxx11::string::append((char *)local_90);
        local_d0._M_dataplus._M_p = (pointer)*plVar4;
        psVar6 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_d0._M_dataplus._M_p == psVar6) {
          local_d0.field_2._M_allocated_capacity = *psVar6;
          local_d0.field_2._8_8_ = plVar4[3];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar6;
        }
        local_d0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::to_string(&local_70,0x402);
        std::operator+(&local_50,&local_d0,&local_70);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_b0 = (long *)*plVar4;
        plVar7 = plVar4 + 2;
        if (local_b0 == plVar7) {
          local_a0 = *plVar7;
          lStack_98 = plVar4[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar7;
        }
        local_a8 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_f0 = (long *)*plVar4;
        plVar7 = plVar4 + 2;
        if (local_f0 == plVar7) {
          local_e0 = *plVar7;
          lStack_d8 = plVar4[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *plVar7;
        }
        local_e8 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::logic_error::logic_error(plVar3,(string *)&local_f0);
        __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      uVar5 = 3;
    }
  }
  else if (TVar1 == Unique0Keyword) {
    uVar5 = 2;
  }
  else {
    if (TVar1 != UniqueKeyword) goto LAB_0027df01;
    uVar5 = 1;
  }
  *(uint *)this = uVar5;
  *(uint *)(this + 4) = uVar2 & 0xffff;
  return (tuple<slang::ast::CaseStatementCondition,_slang::ast::CaseStatementCheck>)
         (_Tuple_impl<0UL,_slang::ast::CaseStatementCondition,_slang::ast::CaseStatementCheck>)this;
}

Assistant:

static std::tuple<CaseStatementCondition, CaseStatementCheck> getConditionAndCheck(
    const CaseStatementSyntax& syntax) {

    CaseStatementCondition condition;
    switch (syntax.caseKeyword.kind) {
        case TokenKind::CaseKeyword:
            condition = CaseStatementCondition::Normal;
            break;
        case TokenKind::CaseXKeyword:
            condition = CaseStatementCondition::WildcardXOrZ;
            break;
        case TokenKind::CaseZKeyword:
            condition = CaseStatementCondition::WildcardJustZ;
            break;
        default:
            ASSUME_UNREACHABLE;
    }

    CaseStatementCheck check;
    switch (syntax.uniqueOrPriority.kind) {
        case TokenKind::Unknown:
            check = CaseStatementCheck::None;
            break;
        case TokenKind::UniqueKeyword:
            check = CaseStatementCheck::Unique;
            break;
        case TokenKind::Unique0Keyword:
            check = CaseStatementCheck::Unique0;
            break;
        case TokenKind::PriorityKeyword:
            check = CaseStatementCheck::Priority;
            break;
        default:
            ASSUME_UNREACHABLE;
    }

    return {condition, check};
}